

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O3

bool absl::anon_unknown_0::HandleEdgeCase<float>
               (ParsedFloat *input,bool negative,Nonnull<float_*> value)

{
  char *__src;
  size_t sVar1;
  long __n2;
  size_t __n;
  float fVar2;
  char n_char_sequence [128];
  char local_98 [128];
  
  if (input->type == kInfinity) {
    if (negative) {
      fVar2 = -INFINITY;
    }
    else {
      fVar2 = INFINITY;
    }
  }
  else if (input->type == kNan) {
    __src = input->subrange_begin;
    if (__src == (char *)0x0) {
      local_98[0] = '\0';
    }
    else {
      sVar1 = (long)input->subrange_end - (long)__src;
      __n = 0x7f;
      if ((long)sVar1 < 0x7f) {
        __n = sVar1;
      }
      if (0 < (long)sVar1) {
        memmove(local_98,__src,__n);
      }
      local_98[__n] = '\0';
    }
    fVar2 = nanf(local_98);
    if (negative) {
      fVar2 = -fVar2;
    }
  }
  else {
    if (input->mantissa != 0) {
      return false;
    }
    if (negative) {
      fVar2 = -0.0;
    }
    else {
      fVar2 = 0.0;
    }
  }
  *value = fVar2;
  return true;
}

Assistant:

bool HandleEdgeCase(const strings_internal::ParsedFloat& input, bool negative,
                    absl::Nonnull<FloatType*> value) {
  if (input.type == strings_internal::FloatType::kNan) {
    // A bug in both clang < 7 and gcc would cause the compiler to optimize
    // away the buffer we are building below.  Declaring the buffer volatile
    // avoids the issue, and has no measurable performance impact in
    // microbenchmarks.
    //
    // https://bugs.llvm.org/show_bug.cgi?id=37778
    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=86113
    constexpr ptrdiff_t kNanBufferSize = 128;
#if (defined(__GNUC__) && !defined(__clang__)) || \
    (defined(__clang__) && __clang_major__ < 7)
    volatile char n_char_sequence[kNanBufferSize];
#else
    char n_char_sequence[kNanBufferSize];
#endif
    if (input.subrange_begin == nullptr) {
      n_char_sequence[0] = '\0';
    } else {
      ptrdiff_t nan_size = input.subrange_end - input.subrange_begin;
      nan_size = std::min(nan_size, kNanBufferSize - 1);
      std::copy_n(input.subrange_begin, nan_size, n_char_sequence);
      n_char_sequence[nan_size] = '\0';
    }
    char* nan_argument = const_cast<char*>(n_char_sequence);
    *value = negative ? -FloatTraits<FloatType>::MakeNan(nan_argument)
                      : FloatTraits<FloatType>::MakeNan(nan_argument);
    return true;
  }
  if (input.type == strings_internal::FloatType::kInfinity) {
    *value = negative ? -std::numeric_limits<FloatType>::infinity()
                      : std::numeric_limits<FloatType>::infinity();
    return true;
  }
  if (input.mantissa == 0) {
    *value = negative ? -0.0 : 0.0;
    return true;
  }
  return false;
}